

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O2

void cp_newline(CPState *cp)

{
  byte bVar1;
  
  bVar1 = *cp->p;
  if (((bVar1 == 0xd) || (bVar1 == 10)) && (cp->c != (uint)bVar1)) {
    cp->p = cp->p + 1;
  }
  cp->linenumber = cp->linenumber + 1;
  return;
}

Assistant:

static void cp_newline(CPState *cp)
{
  CPChar c = cp_rawpeek(cp);
  if (cp_iseol(c) && c != cp->c) cp->p++;
  cp->linenumber++;
}